

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pubkey_cmp(secp256k1_context *ctx,secp256k1_pubkey *pk0,secp256k1_pubkey *pk1)

{
  int iVar1;
  size_t *in_RDX;
  uchar *in_RSI;
  secp256k1_context *in_RDI;
  size_t outputlen;
  int i;
  secp256k1_pubkey *pk [2];
  uchar out [2] [33];
  int local_7c;
  undefined1 local_68 [33];
  undefined1 auStackY_47 [35];
  uint in_stack_ffffffffffffffdc;
  secp256k1_pubkey *in_stack_ffffffffffffffe0;
  
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    iVar1 = secp256k1_ec_pubkey_serialize
                      (in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      memset(local_68 + (long)local_7c * 0x21,0,0x21);
    }
  }
  iVar1 = secp256k1_memcmp_var(local_68,auStackY_47,0x21);
  return iVar1;
}

Assistant:

int secp256k1_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pk0, const secp256k1_pubkey* pk1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pk0; pk[1] = pk1;
    for (i = 0; i < 2; i++) {
        size_t outputlen = sizeof(out[i]);
        /* If the public key is NULL or invalid, pubkey_serialize will
         * call the illegal_callback and return 0. In that case we will
         * serialize the key as all zeros which is less than any valid public
         * key. This results in consistent comparisons even if NULL or invalid
         * pubkeys are involved and prevents edge cases such as sorting
         * algorithms that use this function and do not terminate as a
         * result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &outputlen, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[1]));
}